

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

IVec4 __thiscall tcu::getFormatMinIntValue(tcu *this,TextureFormat *format)

{
  ChannelType CVar1;
  char cVar2;
  short sVar3;
  int s;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar4;
  IVec4 IVar5;
  TextureFormat *format_local;
  
  CVar1 = format->type;
  if (CVar1 == SIGNED_INT8) {
    cVar2 = std::numeric_limits<signed_char>::min();
    Vector<int,_4>::Vector((Vector<int,_4> *)this,(int)cVar2);
    uVar4 = extraout_RDX;
  }
  else if (CVar1 == SIGNED_INT16) {
    sVar3 = std::numeric_limits<short>::min();
    Vector<int,_4>::Vector((Vector<int,_4> *)this,(int)sVar3);
    uVar4 = extraout_RDX_00;
  }
  else if (CVar1 == SIGNED_INT32) {
    s = std::numeric_limits<int>::min();
    Vector<int,_4>::Vector((Vector<int,_4> *)this,s);
    uVar4 = extraout_RDX_01;
  }
  else {
    Vector<int,_4>::Vector((Vector<int,_4> *)this,0);
    uVar4 = extraout_RDX_02;
  }
  IVar5.m_data[2] = (int)uVar4;
  IVar5.m_data[3] = (int)((ulong)uVar4 >> 0x20);
  IVar5.m_data._0_8_ = this;
  return (IVec4)IVar5.m_data;
}

Assistant:

IVec4 getFormatMinIntValue (const TextureFormat& format)
{
	DE_ASSERT(getTextureChannelClass(format.type) == TEXTURECHANNELCLASS_SIGNED_INTEGER);

	switch (format.type)
	{
		case TextureFormat::SIGNED_INT8:	return IVec4(std::numeric_limits<deInt8>::min());
		case TextureFormat::SIGNED_INT16:	return IVec4(std::numeric_limits<deInt16>::min());
		case TextureFormat::SIGNED_INT32:	return IVec4(std::numeric_limits<deInt32>::min());

		default:
			DE_FATAL("Invalid channel type");
			return IVec4(0);
	}
}